

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureBufferTextureBufferRange::iterate(TextureBufferTextureBufferRange *this)

{
  _Base_ptr *info;
  GLuint *pGVar1;
  GLuint *pGVar2;
  GLuint *pGVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  GLuint GVar7;
  int iVar8;
  undefined4 extraout_var;
  _Base_ptr p_Var10;
  TestError *pTVar11;
  FormatInfo *info_00;
  char *pcVar12;
  byte local_111;
  char *csCode;
  char *vsCode;
  char *fsCode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string fsSource;
  char *varyings [2];
  string csSource;
  string vsSource;
  long lVar9;
  
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  p_Var10 = (this->m_configurations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pGVar1 = &this->m_tf_value_buffer_id;
  pGVar2 = &this->m_ssbo_size_id;
  pGVar3 = &this->m_ssbo_value_id;
  local_111 = 1;
  iVar5 = 0;
  while( true ) {
    if ((_Rb_tree_header *)p_Var10 == &(this->m_configurations)._M_t._M_impl.super__Rb_tree_header)
    {
      if (local_111 == 0) {
        pcVar12 = "Fail";
      }
      else {
        pcVar12 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(local_111 == 0),pcVar12);
      return STOP;
    }
    (**(code **)(lVar9 + 0x6f8))(1,&this->m_tbo_tex_id);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error generating texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x36f);
    (**(code **)(lVar9 + 8))(0x84c0);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error setting active texture unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x371);
    (**(code **)(lVar9 + 0xb8))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_id);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error binding texture buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x373);
    (**(code **)(lVar9 + 0x1300))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,
               *(undefined4 *)((long)&p_Var10[1]._M_left + 4),this->m_tbo_id,iVar5,
               *(undefined4 *)((long)&p_Var10[1]._M_parent + 4));
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error setting buffer object as data store for texture buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x376);
    (**(code **)(lVar9 + 0x6c8))(1,&this->m_tf_size_buffer_id);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x37a);
    (**(code **)(lVar9 + 0x40))(0x8892,this->m_tf_size_buffer_id);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error binding buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x37c);
    (**(code **)(lVar9 + 0x150))(0x8892,4,0,0x88ea);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error allocating buffer object\'s data store!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x37e);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&buffer,(ulong)*(uint *)&p_Var10[1]._M_left,(allocator_type *)&fsSource);
    memset(buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0,(ulong)*(uint *)&p_Var10[1]._M_left);
    (**(code **)(lVar9 + 0x6c8))(1,pGVar1);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,900);
    (**(code **)(lVar9 + 0x40))(0x8892,*pGVar1);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error binding buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x386);
    (**(code **)(lVar9 + 0x150))
              (0x8892,*(undefined4 *)&p_Var10[1]._M_left,
               buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,0x88ea);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error allocating buffer object\'s data store!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x388);
    GVar7 = (**(code **)(lVar9 + 0x3c8))();
    this->m_vsfs_po_id = GVar7;
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error creating program object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x38c);
    varyings[0]._0_4_ = 0x178b514;
    varyings[0]._4_4_ = 0;
    varyings[1]._0_4_ = 0x178b523;
    varyings[1]._4_4_ = 0;
    (**(code **)(lVar9 + 0x14c8))(this->m_vsfs_po_id,2,varyings,0x8c8d);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error setting transform feedback varyings!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x391);
    GVar7 = (**(code **)(lVar9 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar7;
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error creating shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x394);
    GVar7 = (**(code **)(lVar9 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar7;
    dVar6 = (**(code **)(lVar9 + 0x800))();
    pcVar12 = "Error creating shader object!";
    glu::checkError(dVar6,"Error creating shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x397);
    getFragmentShaderCode_abi_cxx11_(&fsSource,(TextureBufferTextureBufferRange *)pcVar12,info_00);
    info = &p_Var10[1]._M_parent;
    getVertexShaderCode_abi_cxx11_
              (&vsSource,(TextureBufferTextureBufferRange *)pcVar12,(FormatInfo *)info);
    fsCode = fsSource._M_dataplus._M_p;
    vsCode = vsSource._M_dataplus._M_p;
    bVar4 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_vsfs_po_id,this->m_fs_id,1,&fsCode,
                       this->m_vs_id,1,&vsCode,(bool *)0x0);
    if (!bVar4) break;
    (**(code **)(lVar9 + 0x1680))(this->m_vsfs_po_id);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error setting active program object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3a4);
    iVar8 = (**(code **)(lVar9 + 0xb48))(this->m_vsfs_po_id,"sampler_buffer");
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error getting uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3a7);
    if (iVar8 == -1) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,"Failed to get uniform location for valid uniform variable",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                 ,0x3aa);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar9 + 0x14f0))(iVar8,0);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error setting value for uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3ae);
    (**(code **)(lVar9 + 0x48))(0x8c8e,0,this->m_tf_size_buffer_id);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error binding buffer object to transform feedback binding point.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3b2);
    (**(code **)(lVar9 + 0x48))(0x8c8e,1,*pGVar1);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error binding buffer object to transform feedback binding point.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3b4);
    (**(code **)(lVar9 + 0x30))(0);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error beginning transform feedback.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3b7);
    (**(code **)(lVar9 + 0x538))(0,0,1);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    (**(code **)(lVar9 + 0x638))();
    glu::checkError(dVar6,"Error drawing arrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3be);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error ending transform feedback.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3bf);
    (**(code **)(lVar9 + 0xdb8))(0x200);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Error setting memory barrier.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x3c2);
    bVar4 = checkResult(this,(FormatInfo *)info,"Vertex/Fragment shader",true);
    local_111 = local_111 & bVar4;
    if (*(char *)&p_Var10[2]._M_parent != '\0') {
      (**(code **)(lVar9 + 0x6c8))(1,pGVar2);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error generating buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3cf);
      (**(code **)(lVar9 + 0x40))(0x8892,*pGVar2);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error binding  buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3d1);
      (**(code **)(lVar9 + 0x150))(0x8892,4,0,0x88ea);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error allocating buffer object\'s data store!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3d3);
      (**(code **)(lVar9 + 0x6c8))(1,pGVar3);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error generating buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3d6);
      (**(code **)(lVar9 + 0x40))(0x8892,*pGVar3);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error binding  buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3d8);
      (**(code **)(lVar9 + 0x150))
                (0x8892,*(undefined4 *)&p_Var10[1]._M_left,
                 buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88ea);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error allocating buffer object\'s data store!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3da);
      GVar7 = (**(code **)(lVar9 + 0x3c8))();
      this->m_cs_po_id = GVar7;
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error creating program object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3de);
      GVar7 = (**(code **)(lVar9 + 0x3f0))(0x91b9);
      this->m_cs_id = GVar7;
      dVar6 = (**(code **)(lVar9 + 0x800))();
      pcVar12 = "Error creating shader object!";
      glu::checkError(dVar6,"Error creating shader object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3e1);
      getComputeShaderCode_abi_cxx11_
                (&csSource,(TextureBufferTextureBufferRange *)pcVar12,(FormatInfo *)info);
      csCode = csSource._M_dataplus._M_p;
      bVar4 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_cs_po_id,this->m_cs_id,1,&csCode,
                         (bool *)0x0);
      if (!bVar4) {
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"Could not build program from valid compute shader code!",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                   ,1000);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar9 + 0x1680))(this->m_cs_po_id);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error setting active program object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3ec);
      (**(code **)(lVar9 + 0x48))(0x90d2,0,*pGVar2);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error binding buffer object to shader storage binding point!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3f0);
      (**(code **)(lVar9 + 0x48))(0x90d2,1,*pGVar3);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error binding buffer object to shader storage binding point!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3f2);
      (**(code **)(lVar9 + 0x80))
                (0,this->m_tbo_tex_id,0,0,0,35000,*(undefined4 *)((long)&p_Var10[1]._M_left + 4));
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error binding texture object to image unit 0!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3f6);
      (**(code **)(lVar9 + 0x528))(1,1,1);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error running compute shader!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3fa);
      (**(code **)(lVar9 + 0xdb8))(0x200);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"Error setting memory barrier!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x3fd);
      bVar4 = checkResult(this,(FormatInfo *)info,"Compute shader",false);
      local_111 = local_111 & bVar4;
      std::__cxx11::string::~string((string *)&csSource);
    }
    iVar8 = *(int *)info;
    cleanIteration(this);
    iVar5 = iVar5 + iVar8;
    std::__cxx11::string::~string((string *)&vsSource);
    std::__cxx11::string::~string((string *)&fsSource);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
  }
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar11,"Could not build program from valid vertex/fragment shader code!",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
             ,0x3a0);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TextureBufferTextureBufferRange::iterate(void)
{
	/* Initialize */
	initTest();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool		testResult = true;
	glw::GLuint offset	 = 0;

	for (std::map<glw::GLenum, FormatInfo>::iterator it = m_configurations.begin(); it != m_configurations.end(); ++it)
	{
		FormatInfo& info = it->second;

		/* Create texture object */
		gl.genTextures(1, &m_tbo_tex_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");
		gl.activeTexture(GL_TEXTURE0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active texture unit!");
		gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture buffer object!");
		gl.texBufferRange(m_glExtTokens.TEXTURE_BUFFER, info.get_internal_format(), m_tbo_id, offset,
						  info.get_not_aligned_size());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting buffer object as data store for texture buffer!");

		/* Create transform feedback buffer objects */
		gl.genBuffers(1, &m_tf_size_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
		gl.bindBuffer(GL_ARRAY_BUFFER, m_tf_size_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLint), DE_NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

		std::vector<glw::GLubyte> buffer(info.get_ssbo_value_size());
		memset(&buffer[0], 0, info.get_ssbo_value_size());

		gl.genBuffers(1, &m_tf_value_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
		gl.bindBuffer(GL_ARRAY_BUFFER, m_tf_value_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
		gl.bufferData(GL_ARRAY_BUFFER, info.get_ssbo_value_size(), &buffer[0], GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

		/* Configure program object using Vertex Shader and Fragment Shader */
		m_vsfs_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

		const char* varyings[] = { "outTextureSize", "outValue" };

		gl.transformFeedbackVaryings(m_vsfs_po_id, 2, varyings, GL_SEPARATE_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting transform feedback varyings!");

		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

		std::string fsSource = getFragmentShaderCode(info);
		std::string vsSource = getVertexShaderCode(info);
		const char* fsCode   = fsSource.c_str();
		const char* vsCode   = vsSource.c_str();

		if (!buildProgram(m_vsfs_po_id, m_fs_id, 1, &fsCode, m_vs_id, 1, &vsCode))
		{
			TCU_FAIL("Could not build program from valid vertex/fragment shader code!");
		}

		gl.useProgram(m_vsfs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

		glw::GLint sampler_location = gl.getUniformLocation(m_vsfs_po_id, "sampler_buffer");
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting uniform location!");
		if (sampler_location == -1)
		{
			TCU_FAIL("Failed to get uniform location for valid uniform variable");
		}

		gl.uniform1i(sampler_location, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for uniform location!");

		/* Configure transform feedback */
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_tf_size_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object to transform feedback binding point.");
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, m_tf_value_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object to transform feedback binding point.");

		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error beginning transform feedback.");

		/* Render */
		gl.drawArrays(GL_POINTS, 0, 1);
		glw::GLenum glerr = gl.getError();

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(glerr, "Error drawing arrays");
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error ending transform feedback.");

		gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier.");

		/* Check results */
		if (!checkResult(info, "Vertex/Fragment shader", true))
		{
			testResult = false;
		}

		/* Run compute shader if internal format is supported by image_load_store */
		if (info.get_is_image_supported())
		{
			/* Create Shader Storage Buffer Object */
			gl.genBuffers(1, &m_ssbo_size_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
			gl.bindBuffer(GL_ARRAY_BUFFER, m_ssbo_size_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding  buffer object!");
			gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLint), 0, GL_DYNAMIC_COPY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

			gl.genBuffers(1, &m_ssbo_value_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
			gl.bindBuffer(GL_ARRAY_BUFFER, m_ssbo_value_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding  buffer object!");
			gl.bufferData(GL_ARRAY_BUFFER, info.get_ssbo_value_size(), &buffer[0], GL_DYNAMIC_COPY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

			/* Create compute shader program */
			m_cs_po_id = gl.createProgram();
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

			m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

			std::string csSource = getComputeShaderCode(info);
			const char* csCode   = csSource.c_str();

			if (!buildProgram(m_cs_po_id, m_cs_id, 1, &csCode))
			{
				TCU_FAIL("Could not build program from valid compute shader code!");
			}

			gl.useProgram(m_cs_po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

			/* Configure SSBO objects */
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo_size_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object to shader storage binding point!");
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_ssbo_value_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object to shader storage binding point!");

			/* Bind texture to image unit*/
			gl.bindImageTexture(0, m_tbo_tex_id, 0, GL_FALSE, 0, GL_READ_ONLY, info.get_internal_format());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit 0!");

			/* Run compute shader */
			gl.dispatchCompute(1, 1, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error running compute shader!");

			gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

			if (!checkResult(info, "Compute shader", false))
			{
				testResult = false;
			}
		}

		offset += info.get_aligned_size();
		cleanIteration();
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}